

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

DirPathPair * __thiscall
capnp::compiler::CompilerMain::interpretSourceFile
          (DirPathPair *__return_storage_ptr__,CompilerMain *this,StringPtr pathStr)

{
  ProcessContext *pPVar1;
  StringPtr pathText;
  bool bVar2;
  int iVar3;
  Filesystem *pFVar4;
  undefined4 extraout_var;
  size_t sVar5;
  SourceDirectory *params_1;
  RefOrVoid<const_kj::ReadableDirectory> pRVar6;
  undefined4 extraout_var_00;
  size_t end;
  OutputDirective *pOVar7;
  undefined4 extraout_var_01;
  Path *pPVar8;
  size_t extraout_RDX;
  void *__child_stack;
  ArrayPtr<const_char> *extraout_RDX_00;
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> *extraout_RDX_01;
  void *in_R8;
  PathPtr PVar9;
  bool local_23a;
  String local_168;
  StringPtr local_150;
  StringPtr local_140;
  StringPtr local_130;
  undefined1 local_120 [8];
  String name;
  OutputDirective *output;
  OutputDirective *__end3;
  OutputDirective *__begin3;
  Vector<capnp::compiler::CompilerMain::OutputDirective> *__range3;
  void *local_e0;
  ArrayDisposer *local_d8;
  int local_bc;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> local_b8;
  SourceDirectory *local_b0;
  SourceDirectory *sdir;
  PathPtr remainder;
  PathPtr prefix;
  size_t i;
  Fault f;
  undefined1 local_50 [8];
  Path path;
  PathPtr cwd;
  CompilerMain *this_local;
  StringPtr pathStr_local;
  
  pathStr_local.content.ptr = (char *)pathStr.content.size_;
  this_local = (CompilerMain *)pathStr.content.ptr;
  pathStr_local.content.size_ = (size_t)__return_storage_ptr__;
  pFVar4 = kj::Own<kj::Filesystem>::operator->(&this->disk);
  iVar3 = (*pFVar4->_vptr_Filesystem[2])();
  path.parts.disposer = (ArrayDisposer *)CONCAT44(extraout_var,iVar3);
  pathText.content.size_ = (size_t)pathStr_local.content.ptr;
  pathText.content.ptr = (char *)this_local;
  params_1 = (SourceDirectory *)pathStr_local.content.ptr;
  kj::PathPtr::evalNative((Path *)local_50,(PathPtr *)&path.parts.disposer,pathText);
  sVar5 = kj::Path::size((Path *)local_50);
  if (sVar5 == 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&i,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x768,FAILED,"path.size() > 0","");
    kj::_::Debug::Fault::fatal((Fault *)&i);
  }
  prefix.parts.size_ = kj::Path::size((Path *)local_50);
  do {
    prefix.parts.size_ = prefix.parts.size_ - 1;
    if (prefix.parts.size_ == 0) {
      local_d8 = path.parts.disposer;
      PVar9.parts.size_ = extraout_RDX;
      PVar9.parts.ptr = (String *)path.parts.disposer;
      bVar2 = kj::Path::startsWith((Path *)local_50,PVar9);
      if (!bVar2) {
        __end3 = kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::begin(&this->outputs);
        pOVar7 = kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::end(&this->outputs);
        params = extraout_RDX_00;
        goto LAB_00317566;
      }
      pFVar4 = kj::Own<kj::Filesystem>::operator->(&this->disk);
      iVar3 = (*pFVar4->_vptr_Filesystem[1])();
      __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar3);
      sVar5 = kj::PathPtr::size((PathPtr *)&path.parts.disposer);
      end = kj::Path::size((Path *)local_50);
      PVar9 = kj::Path::slice((Path *)local_50,sVar5,end);
      local_e0 = (void *)PVar9.parts.size_;
      __range3 = (Vector<capnp::compiler::CompilerMain::OutputDirective> *)PVar9.parts.ptr;
      kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&__range3,local_e0,
                         (int)PVar9.parts.ptr,in_R8);
      goto LAB_003177a1;
    }
    PVar9 = kj::Path::slice((Path *)local_50,0,prefix.parts.size_);
    remainder.parts.size_ = (size_t)PVar9.parts.ptr;
    sVar5 = kj::Path::size((Path *)local_50);
    PVar9 = kj::Path::slice((Path *)local_50,prefix.parts.size_,sVar5);
    remainder.parts.ptr = (String *)PVar9.parts.size_;
    params_1 = (SourceDirectory *)PVar9.parts.ptr;
    sdir = params_1;
    local_b8 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::
               find<kj::PathPtr&>((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>
                                   *)&this->sourceDirectories,(PathPtr *)&remainder.parts.size_);
    local_b0 = kj::_::readMaybe<capnp::compiler::CompilerMain::SourceDirectory>(&local_b8);
  } while (local_b0 == (SourceDirectory *)0x0);
  pRVar6 = kj::Own<const_kj::ReadableDirectory>::operator*(&local_b0->dir);
  __return_storage_ptr__->dir = pRVar6;
  kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&sdir,__child_stack,
                     (int)pRVar6,in_R8);
LAB_003177a1:
  local_bc = 1;
  kj::Path::~Path((Path *)local_50);
  return __return_storage_ptr__;
LAB_00317566:
  if (__end3 == pOVar7) goto LAB_0031771d;
  name.content.disposer = (ArrayDisposer *)__end3;
  kj::str<kj::ArrayPtr<char_const>&>((String *)local_120,(kj *)__end3,params);
  kj::StringPtr::StringPtr(&local_130,"-");
  bVar2 = kj::String::operator!=((String *)local_120,&local_130);
  params_1 = (SourceDirectory *)CONCAT71((int7)((ulong)params_1 >> 8),bVar2);
  local_23a = false;
  if (bVar2) {
    kj::StringPtr::StringPtr(&local_140,"capnp");
    local_23a = kj::String::operator!=((String *)local_120,&local_140);
  }
  if (local_23a == false) {
    local_bc = 0;
  }
  else {
    pPVar1 = this->context;
    kj::str<kj::StringPtr&,char_const(&)[197]>
              (&local_168,(kj *)&this_local,
               (StringPtr *)
               ": File is not in the current directory and does not match any prefix defined with --src-prefix. Please pass an appropriate --src-prefix so I can figure out where to write the output for this file."
               ,(char (*) [197])params_1);
    kj::StringPtr::StringPtr(&local_150,&local_168);
    (*pPVar1->_vptr_ProcessContext[2])(pPVar1,local_150.content.ptr,local_150.content.size_);
    kj::String::~String(&local_168);
    local_bc = 8;
  }
  kj::String::~String((String *)local_120);
  if (local_bc != 0) goto LAB_0031771d;
  __end3 = __end3 + 1;
  params = extraout_RDX_01;
  goto LAB_00317566;
LAB_0031771d:
  pFVar4 = kj::Own<kj::Filesystem>::operator->(&this->disk);
  iVar3 = (**pFVar4->_vptr_Filesystem)();
  __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar3);
  pPVar8 = kj::mv<kj::Path>((Path *)local_50);
  kj::Path::Path(&__return_storage_ptr__->path,pPVar8);
  goto LAB_003177a1;
}

Assistant:

DirPathPair interpretSourceFile(kj::StringPtr pathStr) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    KJ_REQUIRE(path.size() > 0);
    for (size_t i = path.size() - 1; i > 0; i--) {
      auto prefix = path.slice(0, i);
      auto remainder = path.slice(i, path.size());

      KJ_IF_MAYBE(sdir, sourceDirectories.find(prefix)) {
        return { *sdir->dir, remainder.clone() };
      }
    }

    // No source prefix matched. Fall back to heuristic: try stripping the current directory,
    // otherwise don't strip anything.
    if (path.startsWith(cwd)) {
      return { disk->getCurrent(), path.slice(cwd.size(), path.size()).clone() };
    } else {
      // Hmm, no src-prefix matched and the file isn't even in the current directory. This might
      // be OK if we aren't generating any output anyway, but otherwise the results will almost
      // certainly not be what the user wanted. Let's print a warning, unless the output directives
      // are ones which we know do not produce output files. This is a hack.
      for (auto& output: outputs) {
        auto name = kj::str(output.name);
        if (name != "-" && name != "capnp") {
          context.warning(kj::str(pathStr,
              ": File is not in the current directory and does not match any prefix defined with "
              "--src-prefix. Please pass an appropriate --src-prefix so I can figure out where to "
              "write the output for this file."));
          break;
        }
      }

      return { disk->getRoot(), kj::mv(path) };
    }
  }